

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxmlutils.cpp
# Opt level: O2

bool QXmlUtils::isNameChar(QChar c)

{
  bool bVar1;
  
  bVar1 = isBaseChar(c);
  if (!bVar1) {
    bVar1 = isDigit(c);
    if ((!bVar1) &&
       ((0x32 < (ushort)(c.ucs + L'ￓ') ||
        ((0x4000000002003U >> ((ulong)(ushort)(c.ucs + L'ￓ') & 0x3f) & 1) == 0)))) {
      bVar1 = isCombiningChar(c);
      if (!bVar1) {
        bVar1 = isIdeographic(c);
        if (!bVar1) {
          bVar1 = isExtender(c);
          return bVar1;
        }
      }
    }
  }
  return true;
}

Assistant:

bool QXmlUtils::isNameChar(const QChar c)
{
    return isBaseChar(c)
           || isDigit(c)
           || c.unicode() == '.'
           || c.unicode() == '-'
           || c.unicode() == '_'
           || c.unicode() == ':'
           || isCombiningChar(c)
           || isIdeographic(c)
           || isExtender(c);
}